

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::SetUse(LinearScan *this,Instr *instr,RegOpnd *regOpnd)

{
  StackSym *this_00;
  Lifetime *lifetime_00;
  RegNum RVar1;
  IRType IVar2;
  bool bVar3;
  uint32 uVar4;
  uint newUseValue;
  Instr *instr_00;
  Instr *insertInstr;
  RegNum reg;
  Lifetime *lifetime;
  StackSym *sym;
  RegOpnd *regOpnd_local;
  Instr *instr_local;
  LinearScan *this_local;
  
  RVar1 = IR::RegOpnd::GetReg(regOpnd);
  if (RVar1 == RegNOREG) {
    this_00 = regOpnd->m_sym;
    lifetime_00 = *(Lifetime **)&(this_00->scratch).globOpt;
    PrepareForUse(this,lifetime_00);
    if ((*(ushort *)&lifetime_00->field_0x9c & 1) != 0) {
      IVar2 = IR::Opnd::GetType(&regOpnd->super_Opnd);
      RVar1 = GetAssignedTempReg(this,lifetime_00,IVar2);
      if (RVar1 == RegNOREG) {
        bVar3 = StackSym::IsConst(this_00);
        if ((bVar3) && (bVar3 = EncoderMD::TryConstFold(instr,regOpnd), bVar3)) {
          return;
        }
        RVar1 = SecondChanceAllocation(this,lifetime_00,false);
        if (RVar1 == RegNOREG) {
          bVar3 = StackSym::IsConst(this_00);
          if (!bVar3) {
            IVar2 = IR::Opnd::GetType(&regOpnd->super_Opnd);
            bVar3 = RegsAvailable(this,IVar2);
            if ((!bVar3) && (bVar3 = EncoderMD::TryFold(instr,regOpnd), bVar3)) {
              return;
            }
          }
          insertInstr._7_1_ = SecondChanceAllocation(this,lifetime_00,true);
          if (insertInstr._7_1_ == RegNOREG) {
            insertInstr._7_1_ = FindReg(this,(Lifetime *)0x0,regOpnd,false);
            AssignTempReg(this,lifetime_00,insertInstr._7_1_);
          }
          InsertLoad(this,instr,this_00,insertInstr._7_1_);
        }
        else {
          instr_00 = TryHoistLoad(this,instr,lifetime_00);
          InsertLoad(this,instr_00,this_00,RVar1);
        }
      }
    }
    if (((*(ushort *)&lifetime_00->field_0x9c & 1) == 0) &&
       (uVar4 = IR::Instr::GetNumber(instr), uVar4 < lifetime_00->end)) {
      RecordUse(this,lifetime_00,instr,regOpnd,false);
    }
    else {
      newUseValue = GetUseSpillCost(this->loopNest,
                                    (uint)(this->currentOpHelperBlock != (OpHelperBlock *)0x0));
      Lifetime::SubFromUseCount(lifetime_00,newUseValue,this->curLoop);
    }
    BVUnitT<unsigned_long>::Set(&this->instrUseRegs,(uint)lifetime_00->reg);
    SetReg(this,regOpnd);
  }
  else {
    RVar1 = IR::RegOpnd::GetReg(regOpnd);
    RecordLoopUse(this,(Lifetime *)0x0,RVar1);
  }
  return;
}

Assistant:

void
LinearScan::SetUse(IR::Instr *instr, IR::RegOpnd *regOpnd)
{
    if (regOpnd->GetReg() != RegNOREG)
    {
        this->RecordLoopUse(nullptr, regOpnd->GetReg());
        return;
    }

    StackSym *sym = regOpnd->m_sym;
    Lifetime * lifetime = sym->scratch.linearScan.lifetime;

    this->PrepareForUse(lifetime);

    if (lifetime->isSpilled)
    {
        // See if it has been loaded in this basic block
        RegNum reg = this->GetAssignedTempReg(lifetime, regOpnd->GetType());
        if (reg == RegNOREG)
        {
            if (sym->IsConst() && EncoderMD::TryConstFold(instr, regOpnd))
            {
                return;
            }

            reg = this->SecondChanceAllocation(lifetime, false);
            if (reg != RegNOREG)
            {
                IR::Instr *insertInstr = this->TryHoistLoad(instr, lifetime);
                this->InsertLoad(insertInstr, sym, reg);
            }
            else
            {
                // Try folding if there are no registers available
                if (!sym->IsConst() && !this->RegsAvailable(regOpnd->GetType()) && EncoderMD::TryFold(instr, regOpnd))
                {
                    return;
                }

                // We need a reg no matter what.  Try to force second chance to re-allocate this.
                reg = this->SecondChanceAllocation(lifetime, true);

                if (reg == RegNOREG)
                {
                    // Forcing second chance didn't work.
                    // Allocate a new temp reg for it
                    reg = this->FindReg(nullptr, regOpnd);
                    this->AssignTempReg(lifetime, reg);
                }

                this->InsertLoad(instr, sym, reg);
            }
        }
    }
    if (!lifetime->isSpilled && instr->GetNumber() < lifetime->end)
    {
        // Don't border to record the use if this is the last use of the lifetime.
        this->RecordUse(lifetime, instr, regOpnd);
    }
    else
    {
        lifetime->SubFromUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr)), this->curLoop);
    }
    this->instrUseRegs.Set(lifetime->reg);

    this->SetReg(regOpnd);
}